

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tutorial.cpp
# Opt level: O2

void __thiscall
embree::TutorialApplication::renderToFile(TutorialApplication *this,FileName *fileName)

{
  uint uVar1;
  Col4<unsigned_char> *color;
  ImageT<embree::Col4<unsigned_char>_> *this_00;
  uint i;
  uint uVar2;
  TutorialApplication *this_01;
  allocator local_91;
  Ref<embree::Image> image;
  string local_88;
  ISPCCamera ispccamera;
  
  resize(this,this->width,this->height);
  this_01 = (TutorialApplication *)&ispccamera;
  Camera::getISPCCamera
            ((ISPCCamera *)&ispccamera,&this->camera,(ulong)this->width,(ulong)this->height);
  initRayStats(this_01);
  for (uVar2 = 0; uVar2 < this->numFrames; uVar2 = uVar2 + 1) {
    (*(this->super_Application)._vptr_Application[0xb])
              (this->render_time,this,this->pixels,(ulong)this->width,(ulong)this->height,
               (TutorialApplication *)&ispccamera);
  }
  this_00 = (ImageT<embree::Col4<unsigned_char>_> *)::operator_new(0x48);
  uVar2 = this->width;
  uVar1 = this->height;
  color = (Col4<unsigned_char> *)this->pixels;
  std::__cxx11::string::string((string *)&local_88,"",&local_91);
  ImageT<embree::Col4<unsigned_char>_>::ImageT
            (this_00,(ulong)uVar2,(ulong)uVar1,color,true,&local_88,false);
  image.ptr = (Image *)this_00;
  (*(this_00->super_Image).super_RefCount._vptr_RefCount[2])(this_00);
  std::__cxx11::string::~string((string *)&local_88);
  storeImage(&image,fileName);
  if (image.ptr != (Image *)0x0) {
    (*((image.ptr)->super_RefCount)._vptr_RefCount[3])();
  }
  return;
}

Assistant:

void TutorialApplication::renderToFile(const FileName& fileName)
  {
    resize(width,height);
    ISPCCamera ispccamera = camera.getISPCCamera(width,height);
    initRayStats();
    
    for (unsigned int i=0; i<numFrames; i++)
      render(pixels,width,height,render_time,ispccamera);
    
    Ref<Image> image = new Image4uc(width, height, (Col4uc*)pixels);
    storeImage(image, fileName);
  }